

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QList<QModelIndex> * __thiscall
QIconModeViewBase::intersectingSet(QIconModeViewBase *this,QRect *area)

{
  anon_union_8_2_f9ecd746_for_Data_0 in_RSI;
  QBspTree *in_RDI;
  long in_FS_OFFSET;
  QIconModeViewBase *that;
  QList<QModelIndex> *res;
  Data data;
  callback *in_stack_ffffffffffffffa8;
  QBspTree *this_00;
  anon_union_8_2_f9ecd746_for_Data_0 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QBspTree::Data::Data((Data *)&local_10,in_RSI.ptr);
  *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
  (this_00->nodes).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->nodes).d.ptr = (Node *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x887806);
  *(QBspTree **)((long)in_RSI.ptr + 0xb0) = this_00;
  QBspTree::climbTree(this_00,(QRect *)in_RDI,in_stack_ffffffffffffffa8,(QBspTreeData)in_RSI);
  *(undefined8 *)((long)in_RSI.ptr + 0xb0) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QModelIndex> *)in_RDI;
}

Assistant:

QList<QModelIndex> QIconModeViewBase::intersectingSet(const QRect &area) const
{
    QIconModeViewBase *that = const_cast<QIconModeViewBase*>(this);
    QBspTree::Data data(static_cast<void*>(that));
    QList<QModelIndex> res;
    that->interSectingVector = &res;
    that->tree.climbTree(area, &QIconModeViewBase::addLeaf, data);
    that->interSectingVector = nullptr;
    return res;
}